

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

ParamDict * __thiscall ncnn::ParamDict::operator=(ParamDict *this,ParamDict *rhs)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  int iVar3;
  ParamDictPrivate *pPVar4;
  ParamDictPrivate *pPVar5;
  int *piVar6;
  long *plVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  undefined8 *puVar12;
  long lVar13;
  
  if (this != rhs) {
    for (lVar13 = 0x50; lVar13 != 0xe50; lVar13 = lVar13 + 0x70) {
      pPVar4 = rhs->d;
      iVar3 = *(int *)((long)pPVar4->params + lVar13 + -0x50);
      pPVar5 = this->d;
      *(int *)((long)pPVar5->params + lVar13 + -0x50) = iVar3;
      if (iVar3 - 1U < 3) {
        *(undefined4 *)((long)pPVar5->params + lVar13 + -0x4c) =
             *(undefined4 *)((long)pPVar4->params + lVar13 + -0x4c);
      }
      else if (iVar3 == 7) {
        std::__cxx11::string::_M_assign((string *)((long)&pPVar5->params[0].type + lVar13));
      }
      else if (pPVar5 != pPVar4) {
        piVar6 = *(int **)((long)pPVar4->params + lVar13 + -0x40);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = *(int **)((long)pPVar5->params + lVar13 + -0x40);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            plVar7 = *(long **)((long)pPVar5->params + lVar13 + -0x28);
            if (plVar7 == (long *)0x0) {
              free(*(void **)((long)pPVar5->params + lVar13 + -0x48));
            }
            else {
              (**(code **)(*plVar7 + 0x18))();
            }
          }
        }
        puVar12 = (undefined8 *)((long)pPVar5->params + lVar13 + -0x48);
        *(undefined8 *)((long)pPVar5->params + lVar13 + -8) = 0;
        *(undefined8 *)((long)pPVar5->params + lVar13 + -0x3c) = 0;
        *(undefined8 *)((long)pPVar5->params + lVar13 + -0x34) = 0;
        *puVar12 = 0;
        *(undefined8 *)((long)pPVar5->params + lVar13 + -0x40) = 0;
        *(undefined4 *)((long)pPVar5->params + lVar13 + -0x10) = 0;
        *(undefined8 *)((long)pPVar5->params + lVar13 + -0x20) = 0;
        *(undefined8 *)((long)pPVar5->params + lVar13 + -0x18) = 0;
        puVar1 = (undefined8 *)((long)pPVar4->params + lVar13 + -0x48);
        uVar11 = puVar1[1];
        *puVar12 = *puVar1;
        *(undefined8 *)((long)pPVar5->params + lVar13 + -0x40) = uVar11;
        *(undefined8 *)((long)pPVar5->params + lVar13 + -0x38) =
             *(undefined8 *)((long)pPVar4->params + lVar13 + -0x38);
        *(undefined4 *)((long)pPVar5->params + lVar13 + -0x30) =
             *(undefined4 *)((long)pPVar4->params + lVar13 + -0x30);
        *(undefined8 *)((long)pPVar5->params + lVar13 + -0x28) =
             *(undefined8 *)((long)pPVar4->params + lVar13 + -0x28);
        puVar2 = (undefined4 *)((long)pPVar4->params + lVar13 + -0x20);
        uVar8 = puVar2[1];
        uVar9 = puVar2[2];
        uVar10 = puVar2[3];
        *(undefined4 *)((long)pPVar5->params + lVar13 + -0x20) = *puVar2;
        *(undefined4 *)((long)pPVar5->params + lVar13 + -0x1c) = uVar8;
        *(undefined4 *)((long)pPVar5->params + lVar13 + -0x18) = uVar9;
        *(undefined4 *)((long)pPVar5->params + lVar13 + -0x14) = uVar10;
        *(undefined4 *)((long)pPVar5->params + lVar13 + -0x10) =
             *(undefined4 *)((long)pPVar4->params + lVar13 + -0x10);
        *(undefined8 *)((long)pPVar5->params + lVar13 + -8) =
             *(undefined8 *)((long)pPVar4->params + lVar13 + -8);
      }
    }
  }
  return this;
}

Assistant:

ParamDict& ParamDict::operator=(const ParamDict& rhs)
{
    if (this == &rhs)
        return *this;

    for (int i = 0; i < NCNN_MAX_PARAM_COUNT; i++)
    {
        int type = rhs.d->params[i].type;
        d->params[i].type = type;
        if (type == 1 || type == 2 || type == 3)
        {
            d->params[i].i = rhs.d->params[i].i;
        }
        else if (type == 7)
        {
            d->params[i].s = rhs.d->params[i].s;
        }
        else // if (type == 4 || type == 5 || type == 6)
        {
            d->params[i].v = rhs.d->params[i].v;
        }
    }

    return *this;
}